

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvhsah.hpp
# Opt level: O2

void __thiscall BVH::BVH(BVH *this,vector<Object_*,_std::allocator<Object_*>_> *list)

{
  pointer ppOVar1;
  undefined8 *puVar2;
  const_iterator __begin1;
  pointer ppOVar3;
  pair<Primitive_*,_Object_*> local_58;
  _Vector_base<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>
  local_48;
  
  (this->super_Accelarator)._vptr_Accelarator = (_func_int **)&PTR_hit_0015fe38;
  this->root = (treenode *)0x0;
  (this->list).
  super__Vector_base<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->list).
  super__Vector_base<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->list).
  super__Vector_base<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.first =
       (Primitive *)
       ((long)(list->super__Vector_base<Object_*,_std::allocator<Object_*>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(list->super__Vector_base<Object_*,_std::allocator<Object_*>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3);
  github111116::ConsoleLogger::log<char[20],unsigned_long,char[8]>
            (&console,(char (*) [20])"building SAH BVH of",(unsigned_long *)&local_58,
             (char (*) [8])"objects");
  ppOVar3 = (list->super__Vector_base<Object_*,_std::allocator<Object_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppOVar1 = (list->super__Vector_base<Object_*,_std::allocator<Object_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppOVar1 != ppOVar3) {
    for (; ppOVar3 != ppOVar1; ppOVar3 = ppOVar3 + 1) {
      local_58.second = *ppOVar3;
      local_58.first = (local_58.second)->primitive;
      std::vector<std::pair<Primitive*,Object*>,std::allocator<std::pair<Primitive*,Object*>>>::
      emplace_back<std::pair<Primitive*,Object*>>
                ((vector<std::pair<Primitive*,Object*>,std::allocator<std::pair<Primitive*,Object*>>>
                  *)&this->list,&local_58);
    }
    std::
    vector<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>::
    vector((vector<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>
            *)&local_48,&this->list);
    build(this,(vector<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>
                *)&local_48,&this->root);
    std::
    _Vector_base<std::pair<Primitive_*,_Object_*>,_std::allocator<std::pair<Primitive_*,_Object_*>_>_>
    ::~_Vector_base(&local_48);
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "BVH: Object list empty!";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

BVH(const std::vector<Object*>& list) {
		console.log("building SAH BVH of", list.size(), "objects");
		if (list.size() == 0) throw "BVH: Object list empty!";
		for (Object* o: list) {
			this->list.push_back({o->primitive, o});
		}
		build(this->list, root);
		// printSA(root);
	}